

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O0

XXH64_hash_t XXH64(void *input,size_t len,unsigned_long_long seed)

{
  U32 UVar1;
  BYTE *pBVar2;
  U64 UVar3;
  ulong uVar4;
  XXH_endianess endian_detected;
  unsigned_long_long seed_local;
  size_t len_local;
  void *input_local;
  U64 k1_1;
  U64 v4_1;
  U64 v3_1;
  U64 v2_1;
  U64 v1_1;
  BYTE *limit_1;
  U64 h64_1;
  BYTE *bEnd_1;
  BYTE *p_1;
  U64 k1;
  U64 v4;
  U64 v3;
  U64 v2;
  U64 v1;
  BYTE *limit;
  U64 h64;
  BYTE *bEnd;
  BYTE *p;
  
  pBVar2 = (BYTE *)((long)input + len);
  bEnd = (BYTE *)input;
  if (len < 0x20) {
    limit = (BYTE *)(seed + 0x27d4eb2f165667c5);
  }
  else {
    v2 = seed + 0x60ea27eeadc0b5d6;
    v3 = seed + 0xc2b2ae3d27d4eb4f;
    k1 = seed + 0x61c8864e7a143579;
    v4 = seed;
    do {
      UVar3 = XXH_read64(bEnd);
      v2 = XXH64_round(v2,UVar3);
      UVar3 = XXH_read64(bEnd + 8);
      v3 = XXH64_round(v3,UVar3);
      UVar3 = XXH_read64(bEnd + 0x10);
      v4 = XXH64_round(v4,UVar3);
      UVar3 = XXH_read64(bEnd + 0x18);
      k1 = XXH64_round(k1,UVar3);
      bEnd = bEnd + 0x20;
    } while (bEnd <= pBVar2 + -0x20);
    UVar3 = XXH64_mergeRound((v2 << 1 | v2 >> 0x3f) + (v3 << 7 | v3 >> 0x39) +
                             (v4 << 0xc | v4 >> 0x34) + (k1 << 0x12 | k1 >> 0x2e),v2);
    UVar3 = XXH64_mergeRound(UVar3,v3);
    UVar3 = XXH64_mergeRound(UVar3,v4);
    limit = (BYTE *)XXH64_mergeRound(UVar3,k1);
  }
  limit = limit + len;
  for (; bEnd + 8 <= pBVar2; bEnd = bEnd + 8) {
    UVar3 = XXH_read64(bEnd);
    UVar3 = XXH64_round(0,UVar3);
    limit = (BYTE *)(((UVar3 ^ (ulong)limit) << 0x1b | (UVar3 ^ (ulong)limit) >> 0x25) *
                     -0x61c8864e7a143579 + -0x7a1435883d4d519d);
  }
  if (bEnd + 4 <= pBVar2) {
    UVar1 = XXH_read32(bEnd);
    uVar4 = (ulong)UVar1 * -0x61c8864e7a143579 ^ (ulong)limit;
    limit = (BYTE *)((uVar4 << 0x17 | uVar4 >> 0x29) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9);
    bEnd = bEnd + 4;
  }
  for (; bEnd < pBVar2; bEnd = bEnd + 1) {
    uVar4 = (ulong)*bEnd * 0x27d4eb2f165667c5 ^ (ulong)limit;
    limit = (BYTE *)((uVar4 << 0xb | uVar4 >> 0x35) * -0x61c8864e7a143579);
  }
  uVar4 = ((ulong)limit >> 0x21 ^ (ulong)limit) * -0x3d4d51c2d82b14b1;
  uVar4 = (uVar4 >> 0x1d ^ uVar4) * 0x165667b19e3779f9;
  return uVar4 >> 0x20 ^ uVar4;
}

Assistant:

XXH_PUBLIC_API unsigned long long XXH64 (const void* input, size_t len, unsigned long long seed)
{
#if 0
    /* Simple version, good for code maintenance, but unfortunately slow for small inputs */
    XXH64_CREATESTATE_STATIC(state);
    XXH64_reset(state, seed);
    XXH64_update(state, input, len);
    return XXH64_digest(state);
#else
    XXH_endianess endian_detected = (XXH_endianess)XXH_CPU_LITTLE_ENDIAN;

    if (XXH_FORCE_ALIGN_CHECK) {
        if ((((size_t)input) & 7)==0) {  /* Input is aligned, let's leverage the speed advantage */
            if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
                return XXH64_endian_align(input, len, seed, XXH_littleEndian, XXH_aligned);
            else
                return XXH64_endian_align(input, len, seed, XXH_bigEndian, XXH_aligned);
    }   }

    if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH64_endian_align(input, len, seed, XXH_littleEndian, XXH_unaligned);
    else
        return XXH64_endian_align(input, len, seed, XXH_bigEndian, XXH_unaligned);
#endif
}